

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

uint32 __thiscall
Process::start(Process *this,String *program,int argc,char **argv,Map<String,_String> *environment)

{
  code *pcVar1;
  long lVar2;
  FILE *__stream;
  Iterator IVar3;
  uint32 uVar4;
  int *piVar5;
  char *pcVar6;
  undefined1 this_00 [8];
  char *pcVar7;
  int iVar8;
  Iterator end;
  String **ppSVar9;
  char **ppcVar10;
  String *apSStack_60 [2];
  char **local_50;
  undefined1 auStack_48 [8];
  Array<String> envStringsBuf;
  
  ppSVar9 = apSStack_60 + 1;
  if (this->pid == 0) {
    if ((argc == 0) || (argv[(long)argc + -1] != (char *)0x0)) {
      iVar8 = argc + (uint)(argc == 0);
      lVar2 = -((long)iVar8 * 8 + 0x17U & 0xfffffffffffffff0);
      ppSVar9 = (String **)((long)apSStack_60 + lVar2 + 8U);
      ((char **)ppSVar9)[iVar8] = (char *)0x0;
      if (1 < iVar8) {
        *(undefined8 *)((long)apSStack_60 + lVar2) = 0x106b49;
        memcpy((void *)((long)&local_50 + lVar2),argv + 1,(ulong)(iVar8 - 1) << 3);
      }
      *(undefined8 *)((long)apSStack_60 + lVar2) = 0x106b51;
      pcVar6 = String::operator_cast_to_char_(program);
      *ppSVar9 = (String *)pcVar6;
      argv = (char **)ppSVar9;
    }
    auStack_48 = (undefined1  [8])0x0;
    envStringsBuf._begin.item = (String *)0x0;
    envStringsBuf._end.item = (String *)0x0;
    ppcVar10 = _environ;
    if (environment->root != (Item *)0x0) {
      apSStack_60[1] = program;
      local_50 = argv;
      ppSVar9[-1] = (String *)0x106b93;
      anon_unknown.dwarf_af88::prepareEnv(environment,(Array<String> *)auStack_48);
      IVar3 = envStringsBuf._begin;
      ppSVar9 = (String **)
                ((long)ppSVar9 -
                (((ulong)((long)envStringsBuf._begin.item - (long)auStack_48) >> 3) *
                 0x6666666666666668 + 0x17 & 0xfffffffffffffff0));
      ppcVar10 = (char **)ppSVar9;
      program = apSStack_60[1];
      for (this_00 = auStack_48; apSStack_60[1] = program, (undefined1  [8])IVar3.item != this_00;
          this_00 = (undefined1  [8])((long)this_00 + 0x28)) {
        ((char **)ppSVar9)[-1] = (char *)0x106bd7;
        pcVar6 = String::operator_cast_to_char_((String *)this_00);
        *ppcVar10 = pcVar6;
        ppcVar10 = ppcVar10 + 1;
        program = apSStack_60[1];
      }
      *ppcVar10 = (char *)0x0;
      argv = local_50;
      ppcVar10 = (char **)ppSVar9;
    }
    ((char **)ppSVar9)[-1] = (char *)0x106c07;
    uVar4 = vfork();
    if (uVar4 == 0xffffffff) {
      uVar4 = 0;
    }
    else if (uVar4 == 0) {
      ((char **)ppSVar9)[-1] = (char *)0x106c18;
      pcVar6 = String::operator_cast_to_char_(program);
      ((char **)ppSVar9)[-1] = (char *)0x106c26;
      iVar8 = execvpe(pcVar6,argv,ppcVar10);
      __stream = _stderr;
      if (iVar8 == -1) {
        ((char **)ppSVar9)[-1] = (char *)0x106c8a;
        pcVar6 = String::operator_cast_to_char_(program);
        ((char **)ppSVar9)[-1] = (char *)0x106c92;
        piVar5 = __errno_location();
        iVar8 = *piVar5;
        ((char **)ppSVar9)[-1] = (char *)0x106c99;
        pcVar7 = strerror(iVar8);
        ((char **)ppSVar9)[-1] = (char *)0x106cb0;
        fprintf(__stream,"%s: %s\n",pcVar6,pcVar7);
        ((char **)ppSVar9)[-1] = &LAB_00106cba;
        _exit(1);
      }
      uVar4 = 0;
      ((char **)ppSVar9)[-1] = (char *)0x106c4e;
      iVar8 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                            ,0x13d,"false");
      if (iVar8 != 0) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
    }
    else {
      this->pid = uVar4;
    }
    ((char **)ppSVar9)[-1] = (char *)0x106c67;
    Array<String>::~Array((Array<String> *)auStack_48);
  }
  else {
    apSStack_60[0] = (String *)0x106ae2;
    piVar5 = __errno_location();
    *piVar5 = 0x16;
    uVar4 = 0;
  }
  return uVar4;
}

Assistant:

uint32 Process::start(const String& program, int argc, char* const argv[], const Map<String, String>& environment)
{
#ifdef _WIN32
  return start(Private::getCommandLine(program, argc, argv), environment);
#else
  if (pid)
  {
    errno = EINVAL;
    return false;
  }

  // prepare argv of child
  const char** args;
  if(argc && !argv[argc - 1])
    args = (const char**)argv;
  else
  {
    if(!argc)
      ++argc;
    args = (const char**)alloca(sizeof(const char*) * (argc + 1));
    args[argc] = 0;
    for (int i = 1; i < argc; ++i)
      args[i] = argv[i];
    args[0] = program;
  }

  // prepare env of child
  char** env = ::environ;
  Array<String> envStringsBuf;
  if (!environment.isEmpty())
  {
    prepareEnv(environment, envStringsBuf);
    env = (char**)alloca(sizeof(char*) * (envStringsBuf.size() + 1));
    char** ienv = env;
    for (Array<String>::Iterator i = envStringsBuf.begin(), end = envStringsBuf.end(); i != end; ++i)
      *(ienv++) = (char*)(const char*)*i;
    *ienv = 0;
  }

  // start process
  int r = vfork();
  if (r == -1)
    return 0;
  else if (r != 0) // parent
  {
    pid = r;
    return r;
  }
  else // child
  {
    if(execvpe(program, (char* const*)args, env) == -1)
    {
      fprintf(stderr, "%s: %s\n", (const char*)program, strerror(errno));
      _exit(EXIT_FAILURE);
    }
    ASSERT(false); // unreachable
    return 0;
  }
#endif
}